

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmain.c
# Opt level: O2

void p_libsys_shutdown(void)

{
  if (pp_plibsys_inited == '\x01') {
    pp_plibsys_inited = 0;
    p_library_loader_shutdown();
    p_time_profiler_shutdown();
    p_rwlock_shutdown();
    p_cond_variable_shutdown();
    p_uthread_shutdown();
    p_socket_close_once();
    p_atomic_thread_shutdown();
    p_mem_shutdown();
    return;
  }
  return;
}

Assistant:

P_LIB_API void
p_libsys_shutdown (void)
{
	if (P_UNLIKELY (pp_plibsys_inited == FALSE))
		return;

	pp_plibsys_inited = FALSE;

	p_library_loader_shutdown ();
	p_time_profiler_shutdown ();
	p_rwlock_shutdown ();
	p_cond_variable_shutdown ();
	p_uthread_shutdown ();
	p_socket_close_once ();
	p_atomic_thread_shutdown ();
	p_mem_shutdown ();
}